

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int tx_witness_stack_free(wally_tx_witness_stack *stack,_Bool free_parent)

{
  void *p;
  int in_EAX;
  int extraout_EAX;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  
  if (stack != (wally_tx_witness_stack *)0x0) {
    if (stack->items != (wally_tx_witness_item *)0x0) {
      uVar1 = stack->num_items;
      if (uVar1 != 0) {
        lVar2 = 8;
        uVar3 = 0;
        do {
          p = *(void **)((long)stack->items + lVar2 + -8);
          if (p != (void *)0x0) {
            clear_and_free(p,*(size_t *)((long)&stack->items->witness + lVar2));
          }
          uVar3 = uVar3 + 1;
          uVar1 = stack->num_items;
          lVar2 = lVar2 + 0x10;
        } while (uVar3 < uVar1);
      }
      clear_and_free(stack->items,uVar1 << 4);
    }
    wally_clear(stack,0x18);
    wally_free(stack);
    return extraout_EAX;
  }
  return in_EAX;
}

Assistant:

static int tx_witness_stack_free(struct wally_tx_witness_stack *stack,
                                 bool free_parent)
{
    size_t i;

    if (stack) {
        if (stack->items) {
            for (i = 0; i < stack->num_items; ++i) {
                if (stack->items[i].witness)
                    clear_and_free(stack->items[i].witness,
                                   stack->items[i].witness_len);
            }
            clear_and_free(stack->items, stack->num_items * sizeof(*stack->items));
        }
        wally_clear(stack, sizeof(*stack));
        if (free_parent)
            wally_free(stack);
    }
    return WALLY_OK;
}